

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

bool __thiscall DepsLog::UpdateDeps(DepsLog *this,int out_id,Deps *deps)

{
  vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_> *this_00;
  Deps *pDVar1;
  
  this_00 = &this->deps_;
  if ((int)((ulong)((long)(this->deps_).
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->deps_).
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3) <= out_id) {
    std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::resize
              (this_00,(long)(out_id + 1));
  }
  pDVar1 = (this_00->super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>)._M_impl.
           super__Vector_impl_data._M_start[out_id];
  if (pDVar1 != (Deps *)0x0) {
    if (pDVar1->nodes != (Node **)0x0) {
      operator_delete__(pDVar1->nodes);
    }
    operator_delete(pDVar1,0x18);
  }
  (this_00->super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>)._M_impl.
  super__Vector_impl_data._M_start[out_id] = deps;
  return pDVar1 != (Deps *)0x0;
}

Assistant:

bool DepsLog::UpdateDeps(int out_id, Deps* deps) {
  if (out_id >= (int)deps_.size())
    deps_.resize(out_id + 1);

  bool delete_old = deps_[out_id] != NULL;
  if (delete_old)
    delete deps_[out_id];
  deps_[out_id] = deps;
  return delete_old;
}